

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.h
# Opt level: O3

double __thiscall YCbCr::operator[](YCbCr *this,uint ID)

{
  runtime_error *this_00;
  
  if (ID != 1) {
    if (ID == 3) {
      this = (YCbCr *)&this->field_2;
    }
    else {
      if (ID != 2) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Error - no such ID");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this = (YCbCr *)&this->field_1;
    }
  }
  return (double)(this->field_0).Y;
}

Assistant:

double operator[] (uint ID) {
        switch (ID) {
        case 1: return Y;
        case 2: return Cb;
        case 3: return Cr;
        default:
            throw std::runtime_error("Error - no such ID");
        }
    }